

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  bool use_magic_number;
  bool bVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  istream *input_stream;
  int iVar15;
  long lVar16;
  char *pcVar17;
  bool bVar18;
  int num_target_order;
  int num_source_order;
  allocator local_519;
  undefined8 local_518;
  int num_mixture;
  vector<double,_std::allocator<double>_> coefficients;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  source_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  window_coefficients;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  target_vectors;
  double magic_number;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  vector<double,_std::allocator<double>_> weights;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  vector<double,_std::allocator<double>_> coefficients_3;
  bool local_380;
  ostringstream error_message;
  uint auStack_260 [122];
  option long_options [2];
  
  num_target_order = 0x19;
  num_mixture = 0x10;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  magic_number = 0.0;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  window_coefficients.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  long_options[1].flag = (int *)0x0;
  long_options[1].val = 0;
  long_options[1]._28_4_ = 0;
  long_options[1].name = (char *)0x0;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[0].flag = (int *)0x0;
  long_options[0].val = 1000;
  long_options[0]._28_4_ = 0;
  long_options[0].name = "magic";
  long_options[0].has_arg = 1;
  long_options[0]._12_4_ = 0;
  use_magic_number = false;
  bVar5 = false;
  bVar7 = false;
  bVar4 = false;
  local_518 = 0;
  num_source_order = num_target_order;
  do {
    iVar8 = ya_getopt_long_only(argc,argv,"l:m:L:M:k:fd:D:r:h",long_options,(int *)0x0);
    switch(iVar8) {
    case 100:
      if (!bVar5) {
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
        bVar3 = sptk::ConvertStringToDouble((string *)&error_message,(double *)&weights);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar3) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&coefficients,(value_type_conflict *)&weights);
          for (; ya_optind < argc; ya_optind = ya_optind + 1) {
            std::__cxx11::string::string
                      ((string *)&error_message,argv[ya_optind],(allocator *)&coefficients_3);
            bVar18 = sptk::ConvertStringToDouble((string *)&error_message,(double *)&weights);
            std::__cxx11::string::~string((string *)&error_message);
            if (!bVar18) break;
            std::vector<double,_std::allocator<double>_>::push_back
                      (&coefficients,(value_type_conflict *)&weights);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&window_coefficients,(value_type *)&coefficients);
          iVar8 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,"The argument for the -d option must be numeric"
                         );
          std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&mean_vectors);
          sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
          std::__cxx11::string::~string((string *)&coefficients_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
          iVar8 = 1;
          local_518 = 1;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
        if (bVar3) break;
        goto LAB_00103eea;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "-d and -r options cannot be specified at the same time");
      std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
      sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
      goto LAB_001048ba;
    case 0x65:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
switchD_00103872_caseD_65:
      anon_unknown.dwarf_4a7d::PrintUsage((ostream *)&std::cerr);
      goto LAB_001048d4;
    case 0x66:
      bVar7 = true;
      break;
    case 0x68:
      iVar8 = 0;
      anon_unknown.dwarf_4a7d::PrintUsage((ostream *)&std::cout);
      goto LAB_001048d8;
    case 0x6b:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
      bVar18 = sptk::ConvertStringToInteger((string *)&error_message,&num_mixture);
      bVar3 = num_mixture < 1;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar18 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -k option must be a positive integer");
        std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
        goto LAB_001048ba;
      }
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
      bVar18 = sptk::ConvertStringToInteger((string *)&error_message,&num_source_order);
      bVar3 = num_source_order < 1;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar18 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -l option must be a positive integer");
        std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
        goto LAB_001048ba;
      }
      num_source_order = num_source_order + -1;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_source_order);
      bVar18 = num_source_order < 0;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3 || bVar18) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        poVar10 = std::operator<<((ostream *)&error_message,
                                  "The argument for the -m option must be a ");
        std::operator<<(poVar10,"non-negative integer");
        std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
        goto LAB_001048ba;
      }
      break;
    case 0x72:
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"-r option cannot be specified multiple times");
        std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
        sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
        goto LAB_001048ba;
      }
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
      bVar5 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&weights);
      if (bVar5) {
        bVar5 = sptk::ComputeFirstOrderRegressionCoefficients
                          ((int)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,&coefficients);
        std::__cxx11::string::~string((string *)&error_message);
        if (!bVar5) goto LAB_00103c89;
        bVar5 = true;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&window_coefficients,(value_type *)&coefficients);
      }
      else {
        std::__cxx11::string::~string((string *)&error_message);
LAB_00103c89:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -r option must be positive integer(s)");
        std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&mean_vectors);
        sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
        std::__cxx11::string::~string((string *)&coefficients_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        bVar5 = false;
        local_518 = 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
      if (!bVar5) goto LAB_00103f35;
      if (ya_optind < argc) {
        std::__cxx11::string::string
                  ((string *)&error_message,argv[ya_optind],(allocator *)&coefficients_3);
        bVar5 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&weights);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar5) {
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar5 = sptk::ComputeSecondOrderRegressionCoefficients
                            ((int)weights.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&coefficients);
          if (bVar5) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&window_coefficients,(value_type *)&coefficients);
            ya_optind = ya_optind + 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,
                            "The argument for the -r option must be positive integer(s)");
            std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&mean_vectors);
            sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
            std::__cxx11::string::~string((string *)&coefficients_3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
            local_518 = 1;
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&coefficients);
          if (!bVar5) goto LAB_00103f35;
        }
      }
      bVar5 = true;
      break;
    default:
      if (iVar8 == 0x44) {
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "-D and -r options cannot be specified at the same time");
          std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
          goto LAB_001048ba;
        }
        std::ifstream::ifstream((string *)&error_message);
        std::ifstream::open((char *)&error_message,(_Ios_Openmode)ya_optarg);
        uVar1 = *(uint *)((long)auStack_260 + *(long *)(_error_message + -0x18));
        if ((uVar1 & 5) == 0) {
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while (bVar3 = sptk::ReadStream<double>((double *)&coefficients,(istream *)&error_message)
                , bVar3) {
            std::vector<double,_std::allocator<double>_>::push_back
                      (&coefficients_3,(value_type_conflict *)&coefficients);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&window_coefficients,
                      (value_type *)
                      &coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
          iVar8 = 4;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
          poVar10 = std::operator<<((ostream *)&coefficients_3,"Cannot open file ");
          std::operator<<(poVar10,ya_optarg);
          std::__cxx11::string::string((string *)&coefficients,"vc",(allocator *)&weights);
          sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
          std::__cxx11::string::~string((string *)&coefficients);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
          iVar8 = 1;
          local_518 = 1;
        }
        std::ifstream::~ifstream((string *)&error_message);
        if ((uVar1 & 5) != 0) goto LAB_00103eea;
      }
      else if (iVar8 == 0x4c) {
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
        bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_target_order);
        bVar4 = num_target_order < 1;
        std::__cxx11::string::~string((string *)&error_message);
        if (!bVar3 || bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "The argument for the -L option must be a positive integer");
          std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
          goto LAB_001048ba;
        }
        num_target_order = num_target_order + -1;
        bVar4 = true;
      }
      else if (iVar8 == 0x4d) {
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
        bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_target_order);
        bVar18 = num_target_order < 0;
        std::__cxx11::string::~string((string *)&error_message);
        bVar4 = true;
        if (!bVar3 || bVar18) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          poVar10 = std::operator<<((ostream *)&error_message,
                                    "The argument for the -M option must be a ");
          std::operator<<(poVar10,"non-negative integer");
          std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
          goto LAB_001048ba;
        }
      }
      else {
        if (iVar8 != 1000) {
          if (iVar8 != -1) goto switchD_00103872_caseD_65;
          goto LAB_00103ef9;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,ya_optarg,(allocator *)&coefficients_3);
        bVar3 = sptk::ConvertStringToDouble((string *)&error_message,&magic_number);
        std::__cxx11::string::~string((string *)&error_message);
        use_magic_number = true;
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "The argument for the -magic option must be a number");
          std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
          sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
          goto LAB_001048ba;
        }
      }
    }
    iVar8 = 0;
LAB_00103eea:
  } while (iVar8 == 0);
  if (iVar8 != 2) {
LAB_00103f35:
    iVar8 = (int)local_518;
    goto LAB_001048d8;
  }
LAB_00103ef9:
  if (!bVar4) {
    num_target_order = num_source_order;
  }
  lVar9 = (long)argc;
  if (argc - ya_optind == 1) {
    lVar13 = lVar9 + -1;
    pcVar17 = (char *)0x0;
LAB_00103f4f:
    pcVar2 = argv[lVar13];
    bVar4 = sptk::SetBinaryMode();
    if (bVar4) {
      std::vector<double,_std::allocator<double>_>::vector
                (&weights,(long)num_mixture,(allocator_type *)&error_message);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&mean_vectors,(long)num_mixture,(allocator_type *)&error_message);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (&covariance_matrices,(long)num_mixture,(allocator_type *)&error_message);
      std::ifstream::ifstream(&error_message);
      std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar2);
      if ((*(byte *)((long)auStack_260 + *(long *)(_error_message + -0x18)) & 5) == 0) {
        iVar8 = (num_source_order + num_target_order + 2) *
                ((int)(((long)window_coefficients.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)window_coefficients.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18) + 1);
        lVar14 = 0;
        lVar16 = 0;
        lVar9 = 0;
        for (lVar13 = 0; bVar4 = num_mixture <= lVar13, lVar13 < num_mixture; lVar13 = lVar13 + 1) {
          bVar5 = sptk::ReadStream<double>
                            ((double *)
                             (CONCAT44(weights.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)weights.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start) + lVar9),
                             (istream *)&error_message);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            std::operator<<((ostream *)&coefficients_3,"Failed to load mixture weight");
            std::__cxx11::string::string((string *)&coefficients,"vc",(allocator *)&source_vectors);
            sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
            goto LAB_00104046;
          }
          bVar5 = sptk::ReadStream<double>
                            (false,0,0,iVar8,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&((mean_vectors.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start + lVar16),
                             (istream *)&error_message,(int *)0x0);
          if (!bVar5) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
            std::operator<<((ostream *)&coefficients_3,"Failed to load mean vector");
            std::__cxx11::string::string((string *)&coefficients,"vc",(allocator *)&source_vectors);
            sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
            goto LAB_00104046;
          }
          sptk::SymmetricMatrix::Resize
                    ((SymmetricMatrix *)
                     ((long)&(covariance_matrices.
                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                     lVar14),iVar8);
          if (bVar7) {
            bVar4 = sptk::ReadStream((SymmetricMatrix *)
                                     ((long)&(covariance_matrices.
                                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _vptr_SymmetricMatrix + lVar14),
                                     (istream *)&error_message);
            if (!bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
              std::operator<<((ostream *)&coefficients_3,"Failed to load covariance matrix");
              std::__cxx11::string::string
                        ((string *)&coefficients,"vc",(allocator *)&source_vectors);
              sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
              goto LAB_00104046;
            }
          }
          else {
            source_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            source_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            source_vectors.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar5 = sptk::ReadStream<double>
                              (false,0,0,iVar8,
                               (vector<double,_std::allocator<double>_> *)&source_vectors,
                               (istream *)&error_message,(int *)0x0);
            if (bVar5) {
              sptk::SymmetricMatrix::SetDiagonal
                        ((SymmetricMatrix *)
                         ((long)&(covariance_matrices.
                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix
                         + lVar14),(vector<double,_std::allocator<double>_> *)&source_vectors);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
              std::operator<<((ostream *)&coefficients_3,"Failed to load diagonal covariance vector"
                             );
              std::__cxx11::string::string
                        ((string *)&coefficients,"vc",(allocator *)&target_vectors);
              sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
              std::__cxx11::string::~string((string *)&coefficients);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
              local_518 = 1;
            }
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)&source_vectors);
            if (!bVar5) break;
          }
          lVar9 = lVar9 + 8;
          lVar16 = lVar16 + 0x18;
          lVar14 = lVar14 + 0x40;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
        poVar10 = std::operator<<((ostream *)&coefficients_3,"Cannot open file ");
        std::operator<<(poVar10,pcVar2);
        std::__cxx11::string::string((string *)&coefficients,"vc",(allocator *)&source_vectors);
        sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
LAB_00104046:
        std::__cxx11::string::~string((string *)&coefficients);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
        local_518 = 1;
        bVar4 = false;
      }
      std::ifstream::~ifstream(&error_message);
      if (bVar4) {
        source_vectors.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        source_vectors.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        source_vectors.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        input_stream = (istream *)&error_message;
        std::ifstream::ifstream(input_stream);
        iVar8 = (int)local_518;
        if ((pcVar17 == (char *)0x0) ||
           (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar17),
           (*(byte *)((long)auStack_260 + *(long *)(_error_message + -0x18)) & 5) == 0)) {
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 == '\0') {
            input_stream = (istream *)&std::cin;
          }
          lVar9 = (long)window_coefficients.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)window_coefficients.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          iVar15 = num_source_order + 1;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          coefficients_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while (bVar4 = sptk::ReadStream<double>
                                   (false,0,0,iVar15 * ((int)(lVar9 / 0x18) + 1),&coefficients_3,
                                    input_stream,(int *)0x0), bVar4) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&source_vectors,&coefficients_3);
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&coefficients_3.super__Vector_base<double,_std::allocator<double>_>);
          bVar4 = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&coefficients_3);
          poVar10 = std::operator<<((ostream *)&coefficients_3,"Cannot open file ");
          std::operator<<(poVar10,pcVar17);
          std::__cxx11::string::string((string *)&coefficients,"vc",(allocator *)&target_vectors);
          sptk::PrintErrorMessage((string *)&coefficients,(ostringstream *)&coefficients_3);
          std::__cxx11::string::~string((string *)&coefficients);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&coefficients_3);
          iVar8 = 1;
          bVar4 = false;
        }
        std::ifstream::~ifstream(&error_message);
        if (bVar4) {
          target_vectors.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          target_vectors.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          target_vectors.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
                    ((GaussianMixtureModelBasedConversion *)&coefficients_3,num_source_order,
                     num_target_order,&window_coefficients,&weights,&mean_vectors,
                     &covariance_matrices,use_magic_number,magic_number);
          if (local_380 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,
                            "Failed to initialize GaussianMixtureModelBasedConversion");
            std::__cxx11::string::string((string *)&coefficients,"vc",&local_519);
            sptk::PrintErrorMessage((string *)&coefficients,&error_message);
LAB_00104943:
            std::__cxx11::string::~string((string *)&coefficients);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
            iVar8 = 1;
            bVar4 = false;
          }
          else {
            bVar7 = sptk::GaussianMixtureModelBasedConversion::Run
                              ((GaussianMixtureModelBasedConversion *)&coefficients_3,
                               &source_vectors,&target_vectors);
            bVar4 = true;
            if (!bVar7) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
              std::operator<<((ostream *)&error_message,"Failed to perform voice conversion");
              std::__cxx11::string::string((string *)&coefficients,"vc",&local_519);
              sptk::PrintErrorMessage((string *)&coefficients,&error_message);
              goto LAB_00104943;
            }
          }
          sptk::GaussianMixtureModelBasedConversion::~GaussianMixtureModelBasedConversion
                    ((GaussianMixtureModelBasedConversion *)&coefficients_3);
          if (bVar4) {
            uVar11 = ((long)target_vectors.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)target_vectors.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18;
            iVar8 = 0;
            uVar12 = uVar11 & 0xffffffff;
            if ((int)uVar11 < 1) {
              uVar12 = 0;
            }
            lVar9 = 0;
            do {
              if (uVar12 * 0x18 + 0x18 == lVar9 + 0x18) goto LAB_00104a40;
              bVar4 = sptk::WriteStream<double>
                                (0,num_target_order + 1,
                                 (vector<double,_std::allocator<double>_> *)
                                 ((long)&((target_vectors.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar9),
                                 (ostream *)&std::cout,(int *)0x0);
              lVar9 = lVar9 + 0x18;
            } while (bVar4);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Failed to write target vectors");
            std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
            sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
            std::__cxx11::string::~string((string *)&coefficients_3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
            iVar8 = 1;
          }
LAB_00104a40:
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&target_vectors);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&source_vectors);
      }
      else {
        iVar8 = (int)local_518;
      }
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                (&covariance_matrices);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&mean_vectors);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&weights.super__Vector_base<double,_std::allocator<double>_>);
      goto LAB_001048d8;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
    sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
  }
  else {
    if (argc - ya_optind == 2) {
      lVar13 = lVar9 + -2;
      pcVar17 = argv[lVar9 + -1];
      goto LAB_00103f4f;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "Just two input files, gmmfile and infile, are required");
    std::__cxx11::string::string((string *)&coefficients_3,"vc",(allocator *)&coefficients);
    sptk::PrintErrorMessage((string *)&coefficients_3,&error_message);
  }
LAB_001048ba:
  std::__cxx11::string::~string((string *)&coefficients_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
LAB_001048d4:
  iVar8 = 1;
LAB_001048d8:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&window_coefficients);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_source_order(kDefaultNumOrder);
  int num_target_order(kDefaultNumOrder);
  bool is_num_target_order_specified(false);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);
  std::vector<std::vector<double> > window_coefficients;
  bool is_regression_specified(false);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:L:M:k:fd:D:r:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_source_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_source_order) ||
            num_source_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        --num_target_order;
        is_num_target_order_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_target_order) ||
            num_target_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_num_target_order_specified = true;
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'd': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-d and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::vector<double> coefficients;
        double coefficient;
        if (!sptk::ConvertStringToDouble(optarg, &coefficient)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be numeric";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        coefficients.push_back(coefficient);
        while (optind < argc &&
               sptk::ConvertStringToDouble(argv[optind], &coefficient)) {
          coefficients.push_back(coefficient);
          ++optind;
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'D': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message
              << "-D and -r options cannot be specified at the same time";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        std::ifstream ifs;
        ifs.open(optarg, std::ios::in | std::ios::binary);
        if (ifs.fail()) {
          std::ostringstream error_message;
          error_message << "Cannot open file " << optarg;
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        std::vector<double> coefficients;
        double coefficient;
        while (sptk::ReadStream(&coefficient, &ifs)) {
          coefficients.push_back(coefficient);
        }
        window_coefficients.push_back(coefficients);
        break;
      }
      case 'r': {
        if (is_regression_specified) {
          std::ostringstream error_message;
          error_message << "-r option cannot be specified multiple times";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }

        int n;
        // Set first order coefficients.
        {
          std::vector<double> coefficients;
          if (!sptk::ConvertStringToInteger(optarg, &n) ||
              !sptk::ComputeFirstOrderRegressionCoefficients(n,
                                                             &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
        }

        // Set second order coefficients.
        if (optind < argc && sptk::ConvertStringToInteger(argv[optind], &n)) {
          std::vector<double> coefficients;
          if (!sptk::ComputeSecondOrderRegressionCoefficients(n,
                                                              &coefficients)) {
            std::ostringstream error_message;
            error_message
                << "The argument for the -r option must be positive integer(s)";
            sptk::PrintErrorMessage("vc", error_message);
            return 1;
          }
          window_coefficients.push_back(coefficients);
          ++optind;
        }
        is_regression_specified = true;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_num_target_order_specified) {
    num_target_order = num_source_order;
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vc", error_message);
    return 1;
  }

  // Load GMM.
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + num_target_order + 2));
    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, read_size, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(read_size);
      if (full_covariance_flag) {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
      } else {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, read_size, &variance, &input_stream,
                              NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("vc", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      }
    }
  }

  // Read input vectors.
  std::vector<std::vector<double> > source_vectors;
  {
    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    const int read_size(static_cast<int>(window_coefficients.size() + 1) *
                        (num_source_order + 1));
    std::vector<double> tmp;
    while (
        sptk::ReadStream(false, 0, 0, read_size, &tmp, &input_stream, NULL)) {
      source_vectors.push_back(tmp);
    }
  }

  // Perform voice conversion.
  std::vector<std::vector<double> > target_vectors;
  {
    sptk::GaussianMixtureModelBasedConversion conversion(
        num_source_order, num_target_order, window_coefficients, weights,
        mean_vectors, covariance_matrices, is_magic_number_specified,
        magic_number);
    if (!conversion.IsValid()) {
      std::ostringstream error_message;
      error_message
          << "Failed to initialize GaussianMixtureModelBasedConversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
    if (!conversion.Run(source_vectors, &target_vectors)) {
      std::ostringstream error_message;
      error_message << "Failed to perform voice conversion";
      sptk::PrintErrorMessage("vc", error_message);
      return 1;
    }
  }

  // Write output vectors.
  {
    const int sequence_length(static_cast<int>(target_vectors.size()));
    for (int t(0); t < sequence_length; ++t) {
      if (!sptk::WriteStream(0, num_target_order + 1, target_vectors[t],
                             &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write target vectors";
        sptk::PrintErrorMessage("vc", error_message);
        return 1;
      }
    }
  }

  return 0;
}